

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O3

void glu::drawFromUserPointers
               (RenderContext *context,deUint32 program,int numVertexArrays,
               VertexArrayBinding *vertexArrays,PrimitiveList *primitives,DrawUtilCallback *callback
               )

{
  PrimitiveType PVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  TestError *this;
  GLenum GVar4;
  GLenum GVar5;
  __normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  first;
  VertexArrayBinding *pVVar6;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> bindingsWithLocations;
  __normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  end;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  int local_3c;
  void *local_38;
  Functions *gl;
  
  iVar3 = (*context->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  first._M_current = (VertexArrayBinding *)0x0;
  end._M_current = (VertexArrayBinding *)0x0;
  (anonymous_namespace)::
  namedBindingsToProgramLocations<glu::VertexArrayBinding_const*,std::insert_iterator<std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
            ((_anonymous_namespace_ *)gl,(Functions *)(ulong)program,(deUint32)vertexArrays,
             vertexArrays + numVertexArrays,(VertexArrayBinding *)&stack0xffffffffffffff98,
             (insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
              )ZEXT816(0));
  bVar2 = (anonymous_namespace)::
          areVertexArrayLocationsValid<__gnu_cxx::__normal_iterator<glu::VertexArrayBinding*,std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
                    (first,end);
  if (!bVar2) {
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,(char *)0x0,
               "areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end())"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
               ,0x1fa);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pVVar6 = first._M_current;
  if (first._M_current != end._M_current) {
    do {
      local_50._M_allocated_capacity._0_4_ = ((first._M_current)->binding).location;
      local_3c = ((first._M_current)->pointer).stride;
      local_38 = ((first._M_current)->pointer).data;
      local_50._4_4_ = ((first._M_current)->pointer).componentType;
      local_50._8_4_ = ((first._M_current)->pointer).convert;
      unique0x100001c0 = *(undefined8 *)&((first._M_current)->pointer).numComponents;
      anon_unknown_4::setVertexAttribPointer(gl,(VertexAttributeDescriptor *)&local_50);
      first._M_current = first._M_current + 1;
    } while (first._M_current != end._M_current);
  }
  if (callback != (DrawUtilCallback *)0x0) {
    (**callback->_vptr_DrawUtilCallback)();
  }
  PVar1 = primitives->type;
  if (primitives->indices == (void *)0x0) {
    GVar5 = 0;
    if (PVar1 < PRIMITIVETYPE_LAST) {
      GVar5 = *(GLenum *)(&DAT_01cbef5c + (ulong)PVar1 * 4);
    }
    (*gl->drawArrays)(GVar5,0,primitives->numElements);
  }
  else {
    GVar5 = 0;
    if (PVar1 < PRIMITIVETYPE_LAST) {
      GVar5 = *(GLenum *)(&DAT_01cbef5c + (ulong)PVar1 * 4);
    }
    GVar4 = 0;
    if (primitives->indexType < INDEXTYPE_LAST) {
      GVar4 = primitives->indexType * 2 + 0x1401;
    }
    (*gl->drawElements)(GVar5,primitives->numElements,GVar4,primitives->indices);
  }
  if (callback != (DrawUtilCallback *)0x0) {
    (*callback->_vptr_DrawUtilCallback[1])(callback);
  }
  for (; pVVar6 != end._M_current; pVVar6 = pVVar6 + 1) {
    (*gl->disableVertexAttribArray)((pVVar6->binding).location);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
             &stack0xffffffffffffff98);
  return;
}

Assistant:

void drawFromUserPointers (const RenderContext& context, deUint32 program, int numVertexArrays, const VertexArrayBinding* vertexArrays, const PrimitiveList& primitives, DrawUtilCallback* callback)
{
	const glw::Functions&				gl		= context.getFunctions();
	std::vector<VertexArrayBinding>		bindingsWithLocations;

	DE_ASSERT(isDrawCallValid(numVertexArrays, vertexArrays, primitives));
	DE_ASSERT(isProgramActive(context, program));

	// Lower bindings to locations.
	namedBindingsToProgramLocations(gl, program, vertexArrays, vertexArrays+numVertexArrays, std::inserter(bindingsWithLocations, bindingsWithLocations.begin()));

	TCU_CHECK(areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end()));

	// Set VA state.
	for (std::vector<VertexArrayBinding>::const_iterator vaIter = bindingsWithLocations.begin(); vaIter != bindingsWithLocations.end(); ++vaIter)
		setVertexAttribPointer(gl, getUserPointerDescriptor(*vaIter));

	if (callback)
		callback->beforeDrawCall();

	if (primitives.indices)
		drawIndexed(gl, primitives.type, primitives.numElements, primitives.indexType, primitives.indices);
	else
		drawNonIndexed(gl, primitives.type, primitives.numElements);

	if (callback)
		callback->afterDrawCall();

	// Disable attribute arrays or otherwise someone later on might get crash thanks to invalid pointers.
	disableVertexArrays(gl, bindingsWithLocations);
}